

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaExporter::ReadMaterialSurface
          (ColladaExporter *this,Surface *poSurface,aiMaterial *pSrcMat,aiTextureType pTexture,
          char *pKey,size_t pType,size_t pIndex)

{
  uint uVar1;
  aiReturn aVar2;
  uint64_t uVar3;
  iterator iVar4;
  DeadlyImportError *this_00;
  uint uvChannel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string index_str;
  uint index;
  aiString texfile;
  
  uVar1 = aiGetMaterialTextureCount(pSrcMat,pTexture);
  if (uVar1 == 0) {
    if (pKey != (char *)0x0) {
      aVar2 = aiGetMaterialColor(pSrcMat,pKey,(uint)pType,(uint)pIndex,&poSurface->color);
      poSurface->exist = aVar2 == aiReturn_SUCCESS;
    }
  }
  else {
    texfile.length = 0;
    texfile.data[0] = '\0';
    memset(texfile.data + 1,0x1b,0x3ff);
    uvChannel = 0;
    aiMaterial::GetTexture
              (pSrcMat,pTexture,0,&texfile,(aiTextureMapping *)0x0,&uvChannel,(ai_real *)0x0,
               (aiTextureOp *)0x0,(aiTextureMapMode *)0x0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&index_str,texfile.data,(allocator<char> *)&local_478);
    if ((index_str._M_string_length == 0) || (*index_str._M_dataplus._M_p != '*')) {
      std::__cxx11::string::assign((char *)&poSurface->texture);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_478,(ulong)&index_str);
      std::__cxx11::string::operator=((string *)&index_str,(string *)&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      uVar3 = strtoul10_64(index_str._M_dataplus._M_p,(char **)0x0,(uint *)0x0);
      index = (uint)uVar3;
      iVar4 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->textures)._M_t,&index);
      if ((_Rb_tree_header *)iVar4._M_node == &(this->textures)._M_t._M_impl.super__Rb_tree_header)
      {
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_478,"could not find embedded texture at index ",&index_str);
        DeadlyImportError::DeadlyImportError(this_00,&local_478);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_assign((string *)&poSurface->texture);
    }
    poSurface->channel = (ulong)uvChannel;
    poSurface->exist = true;
    std::__cxx11::string::~string((string *)&index_str);
  }
  return;
}

Assistant:

void ColladaExporter::ReadMaterialSurface( Surface& poSurface, const aiMaterial* pSrcMat, 
                                          aiTextureType pTexture, const char* pKey, size_t pType, size_t pIndex) {
  if( pSrcMat->GetTextureCount( pTexture) > 0 ) {
    aiString texfile;
    unsigned int uvChannel = 0;
    pSrcMat->GetTexture( pTexture, 0, &texfile, NULL, &uvChannel);

    std::string index_str(texfile.C_Str());

    if(index_str.size() != 0 && index_str[0] == '*') {
        unsigned int index;

        index_str = index_str.substr(1, std::string::npos);

        try {
            index = (unsigned int) strtoul10_64(index_str.c_str());
        } catch(std::exception& error) {
            throw DeadlyExportError(error.what());
        }

        std::map<unsigned int, std::string>::const_iterator name = textures.find(index);

        if(name != textures.end()) {
            poSurface.texture = name->second;
        } else {
            throw DeadlyExportError("could not find embedded texture at index " + index_str);
        }
    } else {
        poSurface.texture = texfile.C_Str();
    }

    poSurface.channel = uvChannel;
    poSurface.exist = true;
  } else {
    if( pKey )
      poSurface.exist = pSrcMat->Get( pKey, static_cast<unsigned int>(pType), static_cast<unsigned int>(pIndex), poSurface.color) == aiReturn_SUCCESS;
  }
}